

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adler32.cc
# Opt level: O1

void __thiscall adler32_variant::hash(adler32_variant *this,adler32_test param,adler32_func adler32)

{
  pointer *__ptr;
  char *message;
  uint32_t adler;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  AssertHelper local_30;
  internal local_28 [8];
  undefined8 *local_20;
  uint32_t local_14;
  
  local_14 = (*adler32)(param.adler,param.buf,param._16_8_);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_28,"adler","param.expect",&local_14,&param.expect);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_20;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_adler32.cc"
               ,0x15f,message);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  if (local_20 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_20 != local_20 + 2) {
      operator_delete((undefined8 *)*local_20);
    }
    operator_delete(local_20);
  }
  return;
}

Assistant:

void hash(adler32_test param, adler32_func adler32) {
        uint32_t adler = adler32((uint32_t)param.adler, param.buf, param.len);
        EXPECT_EQ(adler, param.expect);
    }